

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

void boost::throw_exception<std::ios_base::failure[abi:cxx11]>(failure *e)

{
  clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure>_> *this;
  undefined **local_68 [4];
  undefined **local_48;
  refcount_ptr<boost::exception_detail::error_info_container> local_40;
  char *pcStack_38;
  char *local_30;
  int local_28;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure>_> *)
         __cxa_allocate_exception(0x50);
  std::runtime_error::runtime_error((runtime_error *)local_68,(runtime_error *)e);
  local_68[2] = *(undefined ***)(e + 0x10);
  local_68[3] = *(undefined ***)(e + 0x18);
  local_40.px_ = (error_info_container *)0x0;
  pcStack_38 = (char *)0x0;
  local_30 = (char *)0x0;
  local_28 = -1;
  local_68[0] = &PTR__error_info_injector_00119c10;
  local_48 = &PTR__error_info_injector_00119c38;
  exception_detail::
  clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure>_>::clone_impl
            (this,(error_info_injector<std::ios_base::failure> *)local_68);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure[abi:cxx11]>>
                    ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<std::ios_base::failure>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}